

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O1

void __thiscall
glcts::TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char>::createTextures
          (TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *this)

{
  uchar uVar1;
  GLenum GVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestError *this_00;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  allocator_type local_41;
  vector<unsigned_char,_std::allocator<unsigned_char>_> inputData;
  long lVar5;
  
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar5 + 0x6f8))(1,&this->m_input_to_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x107);
  (**(code **)(lVar5 + 0xb8))((this->m_test_configuration).m_target,this->m_input_to_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x10b);
  iVar3 = (this->m_test_configuration).m_n_in_components;
  GVar2 = (this->m_test_configuration).m_target;
  iVar8 = (this->m_test_configuration).m_height * (this->m_test_configuration).m_width *
          (this->m_test_configuration).m_depth;
  if ((GVar2 == 0x8c1a) || (GVar2 == 0x806f)) {
    (**(code **)(lVar5 + 0x1398))(GVar2,1,(this->m_test_configuration).m_input_internal_format);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Error allocating storage for texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x146);
    if ((this->m_test_configuration).m_input_internal_format != 0x9278) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&inputData,(long)(iVar8 * iVar3),&local_41);
      uVar6 = (this->m_test_configuration).m_height * (this->m_test_configuration).m_width *
              (this->m_test_configuration).m_depth * (this->m_test_configuration).m_n_in_components;
      if (uVar6 != 0) {
        uVar1 = (this->m_test_configuration).m_init_value;
        uVar7 = 0;
        do {
          inputData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] = uVar1;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      (**(code **)(lVar5 + 0x13c0))
                ((this->m_test_configuration).m_target,0,0,0,0,(this->m_test_configuration).m_width,
                 (this->m_test_configuration).m_height,(this->m_test_configuration).m_depth,
                 (this->m_test_configuration).m_input_format,
                 (this->m_test_configuration).m_input_type,
                 inputData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Error filling texture with data!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                      ,0x167);
      goto LAB_00ce8c01;
    }
    (**(code **)(lVar5 + 0x2b0))
              ((this->m_test_configuration).m_target,0,0,0,0,(this->m_test_configuration).m_width,
               (this->m_test_configuration).m_height,(this->m_test_configuration).m_depth,0x9278,
               0x6000,"");
    dVar4 = (**(code **)(lVar5 + 0x800))();
    iVar3 = 0x155;
  }
  else {
    if (GVar2 != 0xde1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,
                 "Test parameters can contain only following targets: GL_TEXTURE_2D, GL_TEXTURE_2D_ARRAY, GL_TEXTURE_3D!"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                 ,0x16d);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar5 + 0x1380))(0xde1,1,(this->m_test_configuration).m_input_internal_format);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Error allocating storage for texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x11c);
    if ((this->m_test_configuration).m_input_internal_format != 0x9278) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&inputData,(long)(iVar8 * iVar3),&local_41);
      uVar6 = (this->m_test_configuration).m_height * (this->m_test_configuration).m_width *
              (this->m_test_configuration).m_depth * (this->m_test_configuration).m_n_in_components;
      if (uVar6 != 0) {
        uVar1 = (this->m_test_configuration).m_init_value;
        uVar7 = 0;
        do {
          inputData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] = uVar1;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      (**(code **)(lVar5 + 0x13b8))
                ((this->m_test_configuration).m_target,0,0,0,(this->m_test_configuration).m_width,
                 (this->m_test_configuration).m_height,(this->m_test_configuration).m_input_format,
                 (this->m_test_configuration).m_input_type,
                 inputData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Error filling texture with data!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                      ,0x139);
LAB_00ce8c01:
      if (inputData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(inputData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)inputData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)inputData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_00ce8c18;
    }
    (**(code **)(lVar5 + 0x2a8))
              ((this->m_test_configuration).m_target,0,0,0,(this->m_test_configuration).m_width,
               (this->m_test_configuration).m_height,0x9278,0x1000,"");
    dVar4 = (**(code **)(lVar5 + 0x800))();
    iVar3 = 0x129;
  }
  glu::checkError(dVar4,"Error filling texture with compressed data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,iVar3);
LAB_00ce8c18:
  (**(code **)(lVar5 + 0x6f8))(1,&this->m_output_to_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x173);
  (**(code **)(lVar5 + 0xb8))(0xde1,this->m_output_to_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x177);
  (**(code **)(lVar5 + 0x1380))
            (0xde1,1,(this->m_test_configuration).m_output_internal_format,
             (this->m_test_configuration).m_width,(this->m_test_configuration).m_height);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error allocating storage for texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x17c);
  return;
}

Assistant:

void TextureBorderClampSamplingTexture<InputType, OutputType>::createTextures(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate input texture */
	gl.genTextures(1, &m_input_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");

	/* Bind input texture */
	gl.bindTexture(m_test_configuration.get_target(), m_input_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	glw::GLsizei components = m_test_configuration.get_n_in_components();
	glw::GLsizei texelsNumber =
		m_test_configuration.get_width() * m_test_configuration.get_height() * m_test_configuration.get_depth();

	/* Allocate storage for input texture and fill it with data */
	{
		switch (m_test_configuration.get_target())
		{
		case GL_TEXTURE_2D:
		{
			gl.texStorage2D(m_test_configuration.get_target(),				  /* target */
							1,												  /* levels */
							m_test_configuration.get_input_internal_format(), /* internalformat */
							m_test_configuration.get_width(),				  /* width */
							m_test_configuration.get_height());				  /* height */
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating storage for texture object!");

			if (m_test_configuration.get_input_internal_format() == GL_COMPRESSED_RGBA8_ETC2_EAC)
			{
				gl.compressedTexSubImage2D(m_test_configuration.get_target(),				 /* target */
										   0,												 /* level */
										   0,												 /* xoffset */
										   0,												 /* yoffset */
										   m_test_configuration.get_width(),				 /* width */
										   m_test_configuration.get_height(),				 /* height */
										   m_test_configuration.get_input_internal_format(), /* internalformat */
										   sizeof(compressed_image_data_2D),				 /* image size */
										   compressed_image_data_2D);						 /* data */
				GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture with compressed data!");
			}
			else
			{
				std::vector<InputType> inputData(components * texelsNumber);
				setInitData(inputData);

				gl.texSubImage2D(m_test_configuration.get_target(),		  /* target */
								 0,										  /* level */
								 0,										  /* xoffset */
								 0,										  /* yoffset */
								 m_test_configuration.get_width(),		  /* width */
								 m_test_configuration.get_height(),		  /* height */
								 m_test_configuration.get_input_format(), /* format */
								 m_test_configuration.get_input_type(),   /* type */
								 &inputData[0]);						  /* data */
				GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture with data!");
			}
			break;
		}
		case GL_TEXTURE_2D_ARRAY:
		case GL_TEXTURE_3D:
		{
			gl.texStorage3D(m_test_configuration.get_target(),				  /* target */
							1,												  /* levels */
							m_test_configuration.get_input_internal_format(), /* internalformat*/
							m_test_configuration.get_width(),				  /* width */
							m_test_configuration.get_height(),				  /* height */
							m_test_configuration.get_depth());				  /* depth */
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating storage for texture object!");

			if (m_test_configuration.get_input_internal_format() == GL_COMPRESSED_RGBA8_ETC2_EAC)
			{
				gl.compressedTexSubImage3D(m_test_configuration.get_target(),				 /* target */
										   0,												 /* level */
										   0,												 /* xoffset */
										   0,												 /* yoffset */
										   0,												 /* zoffset */
										   m_test_configuration.get_width(),				 /* width */
										   m_test_configuration.get_height(),				 /* height */
										   m_test_configuration.get_depth(),				 /* depth */
										   m_test_configuration.get_input_internal_format(), /* internalformat */
										   sizeof(compressed_image_data_2D_array),			 /* image size */
										   compressed_image_data_2D_array);					 /* data */
				GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture with compressed data!");
			}
			else
			{
				std::vector<InputType> inputData(components * texelsNumber);
				setInitData(inputData);

				gl.texSubImage3D(m_test_configuration.get_target(),		  /* target */
								 0,										  /* level */
								 0,										  /* xoffset */
								 0,										  /* yoffset */
								 0,										  /* zoffset */
								 m_test_configuration.get_width(),		  /* width */
								 m_test_configuration.get_height(),		  /* height */
								 m_test_configuration.get_depth(),		  /* depth */
								 m_test_configuration.get_input_format(), /* format */
								 m_test_configuration.get_input_type(),   /* type */
								 &inputData[0]);						  /* data */
				GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture with data!");
			}
			break;
		}
		default:
			TCU_FAIL("Test parameters can contain only following targets: GL_TEXTURE_2D, GL_TEXTURE_2D_ARRAY, "
					 "GL_TEXTURE_3D!");
		}
	}

	/* Generate output texture */
	gl.genTextures(1, &m_output_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");

	/* Bind output texture */
	gl.bindTexture(GL_TEXTURE_2D, m_output_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	/* Allocate storage for output texture */
	gl.texStorage2D(GL_TEXTURE_2D, 1, m_test_configuration.get_output_internal_format(),
					m_test_configuration.get_width(), m_test_configuration.get_height());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating storage for texture object!");
}